

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_client.h
# Opt level: O0

void __thiscall blcl::net::client_interface<MsgType>::disconnect(client_interface<MsgType> *this)

{
  bool bVar1;
  pointer this_00;
  client_interface<MsgType> *this_local;
  
  bVar1 = is_connected(this);
  if (bVar1) {
    this_00 = std::
              unique_ptr<blcl::net::connection<MsgType>,_std::default_delete<blcl::net::connection<MsgType>_>_>
              ::operator->(&this->connection_);
    connection<MsgType>::disconnect(this_00);
  }
  asio::io_context::stop(&this->context_);
  bVar1 = std::thread::joinable(&this->ctx_thread_);
  if (bVar1) {
    std::thread::join();
  }
  std::
  unique_ptr<blcl::net::connection<MsgType>,_std::default_delete<blcl::net::connection<MsgType>_>_>
  ::release(&this->connection_);
  return;
}

Assistant:

void disconnect() {
            if (is_connected())
                connection_->disconnect();

            context_.stop();
            if (ctx_thread_.joinable())
                ctx_thread_.join();
            connection_.release();
        }